

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O1

void vpcmpccb(PDISASM pMyDisasm)

{
  UInt8 UVar1;
  Int32 IVar2;
  Int32 IVar3;
  char *pcVar4;
  
  if (((pMyDisasm->Reserved_).EVEX.state != '\x01') || ((pMyDisasm->Reserved_).VEX.pp != '\x01')) {
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
    (pMyDisasm->Operand1).AccessMode = 0;
    (pMyDisasm->Operand2).AccessMode = 0;
    (pMyDisasm->Operand3).AccessMode = 0;
    (pMyDisasm->Operand4).AccessMode = 0;
    (pMyDisasm->Operand5).AccessMode = 0;
    (pMyDisasm->Operand6).AccessMode = 0;
    (pMyDisasm->Operand7).AccessMode = 0;
    (pMyDisasm->Operand8).AccessMode = 0;
    (pMyDisasm->Operand9).AccessMode = 0;
    (pMyDisasm->Reserved_).ERROR_OPCODE = -1;
    return;
  }
  (pMyDisasm->Reserved_).EVEX.masking = '\x01';
  (pMyDisasm->Reserved_).EVEX.tupletype = '\x01';
  (pMyDisasm->Operand1).AccessMode = 1;
  (pMyDisasm->Instruction).Category = 0x140000;
  (pMyDisasm->Reserved_).Register_ = 0x400;
  decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
  UVar1 = (pMyDisasm->Reserved_).VEX.L;
  if (UVar1 == '\0') {
    IVar2 = 0xd1;
    IVar3 = 4;
  }
  else if (UVar1 == '\x01') {
    IVar2 = 0xd2;
    IVar3 = 8;
  }
  else {
    if ((pMyDisasm->Reserved_).EVEX.LL != '\x02') goto LAB_0013b809;
    IVar2 = 0xd6;
    IVar3 = 0x10;
  }
  (pMyDisasm->Reserved_).Register_ = IVar3;
  (pMyDisasm->Reserved_).MemDecoration = IVar2;
LAB_0013b809:
  fillRegister((uint)(pMyDisasm->Reserved_).EVEX.V << 4 |
               ~(uint)(pMyDisasm->Reserved_).VEX.vvvv & 0xf,&pMyDisasm->Operand2,pMyDisasm);
  decodeModrm(&pMyDisasm->Operand3,pMyDisasm);
  (pMyDisasm->Reserved_).EIP_ =
       (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
  getImmediat8(&pMyDisasm->Operand4,pMyDisasm);
  if ((pMyDisasm->Reserved_).EVEX.W == '\0') {
    pcVar4 = "vpcmpeqb";
  }
  else {
    pcVar4 = "vpcmpeqw";
  }
  strcpy((pMyDisasm->Instruction).Mnemonic,
         pcVar4 + (((uint)(pMyDisasm->Instruction).Immediat & 7) << 4));
  return;
}

Assistant:

void __bea_callspec__ vpcmpccb(PDISASM pMyDisasm)
{
  UInt8 Imm8;

  char pseudoOpcodes_ud[8][16] = {
    "vpcmpeqb",
    "vpcmpltb",
    "vpcmpleb",
    "vpcmpfalseb",
    "vpcmpneqb",
    "vpcmpnltb",
    "vpcmpnleb",
    "vpcmptrueb"
  };
  char pseudoOpcodes_uq[8][16] = {
    "vpcmpeqw",
    "vpcmpltw",
    "vpcmplew",
    "vpcmpfalsew",
    "vpcmpneqw",
    "vpcmpnltw",
    "vpcmpnlew",
    "vpcmptruew"
  };
  if (GV.EVEX.state == InUsePrefix) {
    if (GV.VEX.pp == 1) {
      GV.EVEX.tupletype = FULL;
      GV.EVEX.masking = MERGING;
      pMyDisasm->Operand1.AccessMode = READ;
      pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
      GV.Register_ = OPMASK_REG;
      decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);
      if (GV.VEX.L == 0) {
        GV.Register_ = SSE_REG;
        GV.MemDecoration = Arg3_m128_xmm;
      }
      else if (GV.VEX.L == 0x1) {
        GV.Register_ = AVX_REG;
        GV.MemDecoration = Arg3_m256_ymm;
      }
      else if (GV.EVEX.LL == 0x2) {
        GV.Register_ = AVX512_REG;
        GV.MemDecoration = Arg3_m512_zmm;
      }
      fillRegister((~GV.VEX.vvvv & 0xF) + 16 * GV.EVEX.V, &pMyDisasm->Operand2, pMyDisasm);
      decodeModrm(&pMyDisasm->Operand3, pMyDisasm);
      GV.EIP_ += GV.DECALAGE_EIP+2;
      getImmediat8(&pMyDisasm->Operand4, pMyDisasm);
      Imm8 = pMyDisasm->Instruction.Immediat & 0x7;
      if (GV.EVEX.W == 0) {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, pseudoOpcodes_ud[Imm8]);
        #endif
      }
      else {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, pseudoOpcodes_uq[Imm8]);
        #endif
      }
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else {
    failDecode(pMyDisasm);
  }
}